

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error T1_Get_Var_Design(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_UInt axis_count;
  PS_Blend pPVar1;
  FT_Error FVar2;
  FT_Fixed FVar3;
  PS_DesignMap axismap;
  ulong uVar4;
  ulong uVar5;
  FT_Fixed axiscoords [4];
  
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    FVar2 = 6;
  }
  else {
    axis_count = pPVar1->num_axis;
    mm_weights_unmap(pPVar1->weight_vector,axiscoords,axis_count);
    if (num_coords <= axis_count) {
      axis_count = num_coords;
    }
    uVar5 = (ulong)axis_count;
    axismap = pPVar1->design_map;
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      FVar3 = mm_axis_unmap(axismap,axiscoords[uVar4]);
      coords[uVar4] = FVar3;
      axismap = axismap + 1;
    }
    for (; (num_coords - axis_count) + (int)uVar4 != uVar5; uVar5 = uVar5 + 1) {
      coords[uVar5] = 0;
    }
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_Var_Design( T1_Face    face,
                     FT_UInt    num_coords,
                     FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;

    FT_Fixed  axiscoords[4];
    FT_UInt   i, nc;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    mm_weights_unmap( blend->weight_vector,
                      axiscoords,
                      blend->num_axis );

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "T1_Get_Var_Design:"
                  " only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    for ( i = 0; i < nc; i++ )
      coords[i] = mm_axis_unmap( &blend->design_map[i], axiscoords[i] );
    for ( ; i < num_coords; i++ )
      coords[i] = 0;

    return FT_Err_Ok;
  }